

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O2

void ConvertToMConcatNode(Col_Word *nodePtr)

{
  byte *node;
  ulong in_RAX;
  uint uVar1;
  Col_Word right;
  Col_Word left;
  Col_Word local_28;
  Col_Word local_20;
  
  node = (byte *)*nodePtr;
  if (node != (byte *)0x0) {
    if (((ulong)node & 0xf) == 0) {
      if ((*node & 2) == 0) goto LAB_0010f58b;
      uVar1 = *node & 0xfffffffe;
    }
    else {
      in_RAX = (ulong)((uint)node & 0x1f);
      uVar1 = immediateWordTypes[in_RAX];
    }
    if (uVar1 == 0x22) {
      local_20 = *(Col_Word *)(node + 0x10);
      local_28 = *(Col_Word *)(node + 0x18);
    }
    else {
      if (uVar1 != 0x1e) goto LAB_0010f58b;
      GetArms((Col_Word)node,&local_20,&local_28);
    }
    in_RAX = NewMConcatList(local_20,local_28);
  }
LAB_0010f58b:
  *nodePtr = in_RAX;
  return;
}

Assistant:

static void
ConvertToMConcatNode(
    Col_Word *nodePtr)  /*!< [in,out] Mutable list node to convert. Gets
                             overwritten upon return. */
{
    Col_Word converted;

    switch (WORD_TYPE(*nodePtr)) {
    case WORD_TYPE_SUBLIST: {
        /*
         * Split sublist into mutable concat node.
         */

        Col_Word left, right;

        ASSERT(WORD_SUBLIST_DEPTH(*nodePtr) >= 1);
        ASSERT(WORD_TYPE(WORD_SUBLIST_SOURCE(*nodePtr)) == WORD_TYPE_CONCATLIST);

        GetArms(*nodePtr, &left, &right);

        converted = NewMConcatList(left, right);
        break;
        }

    case WORD_TYPE_CONCATLIST: {
        /*
         * Convert to mutable concat node.
         */

        ASSERT(WORD_CONCATLIST_DEPTH(*nodePtr) >= 1);

        converted = NewMConcatList(WORD_CONCATLIST_LEFT(*nodePtr),
                WORD_CONCATLIST_RIGHT(*nodePtr));
        break;
        }

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    *nodePtr = converted;
}